

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O0

void __thiscall
Rml::FilterDropShadowInstancer::FilterDropShadowInstancer(FilterDropShadowInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_2e9;
  String local_2e8;
  allocator<char> local_2c1;
  String local_2c0;
  allocator<char> local_299;
  String local_298;
  allocator<char> local_271;
  String local_270;
  allocator<char> local_249;
  String local_248;
  allocator<char> local_221;
  String local_220;
  allocator<char> local_1f9;
  String local_1f8;
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  FilterDropShadowInstancer *local_10;
  FilterDropShadowInstancer *this_local;
  
  local_10 = this;
  FilterInstancer::FilterInstancer(&this->super_FilterInstancer);
  (this->super_FilterInstancer)._vptr_FilterInstancer =
       (_func_int **)&PTR__FilterDropShadowInstancer_00817868;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"color",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"transparent",&local_69);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_FilterInstancer).super_EffectSpecification,&local_30,&local_68);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"color",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_90,&local_b8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).color = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"offset-x",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"0px",&local_109);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_FilterInstancer).super_EffectSpecification,&local_e0,&local_108)
  ;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"length",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_130,&local_158);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).offset_x = PVar1;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"offset-y",&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"0px",&local_1a9);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_FilterInstancer).super_EffectSpecification,&local_180,&local_1a8
                     );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"length",&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_1d0,&local_1f8);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).offset_y = PVar1;
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"sigma",&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"0px",&local_249);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_FilterInstancer).super_EffectSpecification,&local_220,&local_248
                     );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"length",&local_271);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_270,&local_298);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).sigma = PVar1;
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::allocator<char>::~allocator(&local_299);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::allocator<char>::~allocator(&local_271);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::allocator<char>::~allocator(&local_249);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator(&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"filter",&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"color, offset-x, offset-y, sigma",&local_2e9);
  EffectSpecification::RegisterShorthand
            (&(this->super_FilterInstancer).super_EffectSpecification,&local_2c0,&local_2e8,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::allocator<char>::~allocator(&local_2e9);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator(&local_2c1);
  return;
}

Assistant:

FilterDropShadowInstancer::FilterDropShadowInstancer()
{
	ids.color = RegisterProperty("color", "transparent").AddParser("color").GetId();
	ids.offset_x = RegisterProperty("offset-x", "0px").AddParser("length").GetId();
	ids.offset_y = RegisterProperty("offset-y", "0px").AddParser("length").GetId();
	ids.sigma = RegisterProperty("sigma", "0px").AddParser("length").GetId();
	RegisterShorthand("filter", "color, offset-x, offset-y, sigma", ShorthandType::FallThrough);
}